

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O3

void vera::ResampleBicubicPrecalc
               (vector<vera::BicubicPrecalc,_std::allocator<vera::BicubicPrecalc>_> *aWeight,
               int oldDim)

{
  BicubicPrecalc *precalc;
  long lVar1;
  ulong uVar2;
  uint uVar3;
  
  precalc = (aWeight->
            super__Vector_base<vera::BicubicPrecalc,_std::allocator<vera::BicubicPrecalc>_>)._M_impl
            .super__Vector_impl_data._M_start;
  uVar3 = (int)((long)(aWeight->
                      super__Vector_base<vera::BicubicPrecalc,_std::allocator<vera::BicubicPrecalc>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)precalc >> 4) *
          -0x55555555;
  if (1 < (int)uVar3) {
    lVar1 = 0;
    uVar2 = 0;
    do {
      DoCalc((BicubicPrecalc *)
             ((long)((aWeight->
                     super__Vector_base<vera::BicubicPrecalc,_std::allocator<vera::BicubicPrecalc>_>
                     )._M_impl.super__Vector_impl_data._M_start)->weight + lVar1),
             (double)(int)uVar2 * ((double)(oldDim + -1) / (double)(int)(uVar3 - 1)),oldDim);
      uVar2 = uVar2 + 1;
      lVar1 = lVar1 + 0x30;
    } while ((uVar3 & 0x7fffffff) != uVar2);
    return;
  }
  DoCalc(precalc,(double)(oldDim + -1) * 0.5,oldDim);
  return;
}

Assistant:

void ResampleBicubicPrecalc(std::vector<BicubicPrecalc> &aWeight, int oldDim) {
    const int newDim = aWeight.size();
    // wxASSERT( oldDim > 0 && newDim > 0 );
    if ( newDim > 1 ) {
        // We want to map pixels in the range [0..newDim-1]
        // to the range [0..oldDim-1]
        const double scale_factor = static_cast<double>(oldDim-1) / (newDim-1);
        for ( int dstd = 0; dstd < newDim; dstd++ ) {
            // We need to calculate the source pixel to interpolate from - Y-axis
            const double srcpixd = static_cast<double>(dstd) * scale_factor;
            DoCalc(aWeight[dstd], srcpixd, oldDim);
        }
    }
    else {
        // Let's take the pixel from the center of the source image.
        const double srcpixd = static_cast<double>(oldDim - 1) / 2.0;
        DoCalc(aWeight[0], srcpixd, oldDim);
    }
}